

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_extract.c
# Opt level: O0

void test_read_extract(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a_00;
  archive_entry *entry;
  archive *paVar3;
  archive_entry *paVar4;
  char *pcVar5;
  wchar_t unaff_retaddr;
  void *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *file_buff;
  char *buff;
  int numEntries;
  int i;
  size_t used;
  archive *a;
  archive_entry *ae;
  undefined4 in_stack_00000050;
  wchar_t in_stack_00000054;
  char *in_stack_00000058;
  wchar_t in_stack_00000064;
  char *in_stack_00000068;
  archive_entry *in_stack_ffffffffffffffb8;
  archive_entry *entry_00;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  wchar_t in_stack_ffffffffffffffc8;
  wchar_t in_stack_ffffffffffffffcc;
  wchar_t local_20;
  wchar_t local_1c;
  
  a_00 = (archive *)malloc(1000000);
  entry = (archive_entry *)malloc(100000);
  assertion_umask((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                  (wchar_t)in_stack_ffffffffffffffb8);
  paVar3 = archive_write_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_write_set_format_ustar
            ((archive *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_write_add_filter_none(paVar3);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_write_open_memory
            (a_00,entry,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (size_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x41fd);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x163d73);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x81ed);
  for (local_1c = 0; local_1c < 100000; local_1c = local_1c + 1) {
    iVar1 = rand();
    *(char *)((long)&entry->archive + (long)local_1c) = (char)iVar1;
  }
  archive_entry_set_size(paVar4,100000);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,0x163e61);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x163e9b);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x41ff);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x163f3d);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x81c0);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x163fdf);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x8000);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x164081);
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x41c8);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x164123);
  local_20 = L'\a';
  paVar4 = archive_entry_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_copy_pathname
            ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8);
  archive_entry_set_mode(paVar4,0x41c9);
  archive_write_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
  archive_entry_free((archive_entry *)0x1641c5);
  wVar2 = canSymlink();
  if (wVar2 != L'\0') {
    local_20 = L'\b';
    paVar4 = archive_entry_new();
    assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)in_stack_ffffffffffffffb8);
    archive_entry_set_mode(paVar4,0xa1ed);
    archive_entry_set_symlink
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)in_stack_ffffffffffffffb8);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
    archive_entry_free((archive_entry *)0x164286);
  }
  archive_write_close((archive *)0x164290);
  assertion_equal_int((char *)a_00,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (longlong)paVar3,(char *)0x1642bf,paVar3);
  archive_write_free((archive *)0x1642c9);
  entry_00 = (archive_entry *)0x0;
  assertion_equal_int((char *)a_00,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1642f7,paVar3);
  paVar3 = archive_read_new();
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  archive_read_support_format_all((archive *)entry_00);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  archive_read_support_filter_all((archive *)entry_00);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  archive_read_open_memory
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00,
             0x1643a8);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  failure("Error reading first entry",(ulong)(uint)local_1c);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (archive_entry **)entry_00);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  archive_read_extract(a_00,entry,in_stack_ffffffffffffffcc);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  for (local_1c = L'\x01'; local_1c < local_20; local_1c = local_1c + L'\x01') {
    failure("Error reading entry %d",(ulong)(uint)local_1c);
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (archive_entry **)entry_00);
    assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00)
    ;
    in_stack_ffffffffffffffcc = local_1c;
    pcVar5 = archive_entry_pathname(entry_00);
    failure("Failed to extract entry %d: %s",(ulong)(uint)in_stack_ffffffffffffffcc,pcVar5);
    archive_read_extract(a_00,entry,in_stack_ffffffffffffffcc);
    assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00)
    ;
  }
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (archive_entry **)entry_00);
  assertion_assert((char *)entry,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),entry_00);
  archive_read_close((archive *)0x16457a);
  assertion_equal_int((char *)a_00,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (longlong)paVar3,(char *)0x1645a9,paVar3);
  archive_read_free((archive *)0x1645b3);
  pcVar5 = (char *)0x0;
  assertion_equal_int((char *)a_00,(wchar_t)((ulong)entry >> 0x20),
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0,
                      (char *)0x1645e1,paVar3);
  failure("This was 0775 in archive, and should be 0775 on disk");
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_reg(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_file_size(in_stack_00000068,in_stack_00000064,in_stack_00000058,
                      CONCAT44(in_stack_00000054,in_stack_00000050));
  assertion_file_contents
            (file_buff,in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)paVar4);
  failure("This was 0777 in archive, but umask should make it 0755");
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_reg(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_reg(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  assertion_is_dir(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000054);
  wVar2 = canSymlink();
  if (wVar2 != L'\0') {
    assertion_is_symlink
              ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc4,pcVar5,(char *)0x1647a1);
  }
  free(a_00);
  free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_read_extract)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int i, numEntries = 0;
	char *buff, *file_buff;

	buff = malloc(BUFF_SIZE);
	file_buff = malloc(FILE_BUFF_SIZE);

	/* Force the umask to something predictable. */
	assertUmask(022);

	/* Create a new archive in memory containing various types of entries. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, BUFF_SIZE, &used));
	/* A directory to be restored with EXTRACT_PERM. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir_0775");
	archive_entry_set_mode(ae, S_IFDIR | 0775);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A regular file. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	for (i = 0; i < FILE_BUFF_SIZE; i++)
		file_buff[i] = (unsigned char)rand();
	archive_entry_set_size(ae, FILE_BUFF_SIZE);
	assertA(0 == archive_write_header(a, ae));
	assertA(FILE_BUFF_SIZE == archive_write_data(a, file_buff, FILE_BUFF_SIZE));
	archive_entry_free(ae);
	/* A directory that should obey umask when restored. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0777);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A file in the directory. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir/file");
	archive_entry_set_mode(ae, S_IFREG | 0700);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A file in a dir that is not already in the archive. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir2/file");
	archive_entry_set_mode(ae, S_IFREG | 0000);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A dir with a trailing /. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir3/.");
	archive_entry_set_mode(ae, S_IFDIR | 0710);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* Multiple dirs with a single entry. */
	++numEntries;
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir4/a/../b/../c/");
	archive_entry_set_mode(ae, S_IFDIR | 0711);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	/* A symlink. */
	if (canSymlink()) {
		++numEntries;
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, "symlink");
		archive_entry_set_mode(ae, AE_IFLNK | 0755);
		archive_entry_set_symlink(ae, "file");
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
	}
	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Extract the entries to disk. */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, BUFF_SIZE));
	/* Restore first entry with _EXTRACT_PERM. */
	failure("Error reading first entry", i);
	assertA(0 == archive_read_next_header(a, &ae));
	assertA(0 == archive_read_extract(a, ae, ARCHIVE_EXTRACT_PERM));
	/* Rest of entries get restored with no flags. */
	for (i = 1; i < numEntries; i++) {
		failure("Error reading entry %d", i);
		assertA(0 == archive_read_next_header(a, &ae));
		failure("Failed to extract entry %d: %s", i,
			archive_entry_pathname(ae));
		assertA(0 == archive_read_extract(a, ae, 0));
	}
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* Test the entries on disk. */
	/* This first entry was extracted with ARCHIVE_EXTRACT_PERM,
	 * so the permissions should have been restored exactly,
	 * including resetting the gid bit on those platforms
	 * where gid is inherited by subdirs. */
	failure("This was 0775 in archive, and should be 0775 on disk");
	assertIsDir("dir_0775", 0775);
	/* Everything else was extracted without ARCHIVE_EXTRACT_PERM,
	 * so there may be some sloppiness about gid bits on directories. */
	assertIsReg("file", 0755);
	assertFileSize("file", FILE_BUFF_SIZE);
	assertFileContents(file_buff, FILE_BUFF_SIZE, "file");
	/* If EXTRACT_PERM wasn't used, be careful to ignore sgid bit
	 * when checking dir modes, as some systems inherit sgid bit
	 * from the parent dir. */
	failure("This was 0777 in archive, but umask should make it 0755");
	assertIsDir("dir", 0755);
	assertIsReg("dir/file", 0700);
	assertIsDir("dir2", 0755);
	assertIsReg("dir2/file", 0000);
	assertIsDir("dir3", 0710);
	assertIsDir("dir4", 0755);
	assertIsDir("dir4/a", 0755);
	assertIsDir("dir4/b", 0755);
	assertIsDir("dir4/c", 0711);
	if (canSymlink())
		assertIsSymlink("symlink", "file");

	free(buff);
	free(file_buff);
}